

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initSQLData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> QStack_1d28;
  pair<char,_QLatin1String> local_1d18;
  undefined1 local_1d00;
  undefined8 local_1cf8;
  char *local_1cf0;
  undefined1 local_1ce8;
  undefined8 local_1ce0;
  char *local_1cd8;
  undefined1 local_1cd0;
  undefined8 local_1cc8;
  char *local_1cc0;
  undefined1 local_1cb8;
  undefined8 local_1cb0;
  char *local_1ca8;
  undefined1 local_1ca0;
  undefined8 local_1c98;
  char *local_1c90;
  undefined1 local_1c88;
  undefined8 local_1c80;
  char *local_1c78;
  undefined1 local_1c70;
  undefined8 local_1c68;
  char *local_1c60;
  undefined1 local_1c58;
  undefined8 local_1c50;
  char *local_1c48;
  undefined1 local_1c40;
  undefined8 local_1c38;
  char *local_1c30;
  undefined1 local_1c28;
  undefined8 local_1c20;
  char *local_1c18;
  undefined1 local_1c10;
  undefined8 local_1c08;
  char *local_1c00;
  undefined1 local_1bf8;
  undefined8 local_1bf0;
  char *local_1be8;
  undefined1 local_1be0;
  undefined8 local_1bd8;
  char *local_1bd0;
  undefined1 local_1bc8;
  undefined8 local_1bc0;
  char *local_1bb8;
  undefined1 local_1bb0;
  undefined8 local_1ba8;
  char *local_1ba0;
  undefined1 local_1b98;
  undefined8 local_1b90;
  char *local_1b88;
  undefined1 local_1b80;
  undefined8 local_1b78;
  char *local_1b70;
  undefined1 local_1b68;
  undefined8 local_1b60;
  char *local_1b58;
  undefined1 local_1b50;
  undefined8 local_1b48;
  char *local_1b40;
  undefined1 local_1b38;
  undefined8 local_1b30;
  char *local_1b28;
  undefined1 local_1b20;
  undefined8 local_1b18;
  char *local_1b10;
  undefined1 local_1b08;
  undefined8 local_1b00;
  char *local_1af8;
  undefined1 local_1af0;
  undefined8 local_1ae8;
  char *local_1ae0;
  undefined1 local_1ad8;
  undefined8 local_1ad0;
  char *local_1ac8;
  undefined1 local_1ac0;
  undefined8 local_1ab8;
  char *local_1ab0;
  undefined1 local_1aa8;
  undefined8 local_1aa0;
  char *local_1a98;
  undefined1 local_1a90;
  undefined8 local_1a88;
  char *local_1a80;
  undefined1 local_1a78;
  undefined8 local_1a70;
  char *local_1a68;
  undefined1 local_1a60;
  undefined8 local_1a58;
  char *local_1a50;
  undefined1 local_1a48;
  undefined8 local_1a40;
  char *local_1a38;
  undefined1 local_1a30;
  undefined8 local_1a28;
  char *local_1a20;
  undefined1 local_1a18;
  undefined8 local_1a10;
  char *local_1a08;
  undefined1 local_1a00;
  undefined8 local_19f8;
  char *local_19f0;
  undefined1 local_19e8;
  undefined8 local_19e0;
  char *local_19d8;
  undefined1 local_19d0;
  undefined8 local_19c8;
  char *local_19c0;
  undefined1 local_19b8;
  undefined8 local_19b0;
  char *local_19a8;
  undefined1 local_19a0;
  undefined8 local_1998;
  char *local_1990;
  undefined1 local_1988;
  undefined8 local_1980;
  char *local_1978;
  undefined1 local_1970;
  undefined8 local_1968;
  char *local_1960;
  undefined1 local_1958;
  undefined8 local_1950;
  char *local_1948;
  undefined1 local_1940;
  undefined8 local_1938;
  char *local_1930;
  undefined1 local_1928;
  undefined8 local_1920;
  char *local_1918;
  undefined1 local_1910;
  undefined8 local_1908;
  char *local_1900;
  undefined1 local_18f8;
  undefined8 local_18f0;
  char *local_18e8;
  undefined1 local_18e0;
  undefined8 local_18d8;
  char *local_18d0;
  undefined1 local_18c8;
  undefined8 local_18c0;
  char *local_18b8;
  undefined1 local_18b0;
  undefined8 local_18a8;
  char *local_18a0;
  undefined1 local_1898;
  undefined8 local_1890;
  char *local_1888;
  undefined1 local_1880;
  undefined8 local_1878;
  char *local_1870;
  undefined1 local_1868;
  undefined8 local_1860;
  char *local_1858;
  undefined1 local_1850;
  undefined8 local_1848;
  char *local_1840;
  undefined1 local_1838;
  undefined8 local_1830;
  char *local_1828;
  undefined1 local_1820;
  undefined8 local_1818;
  char *local_1810;
  undefined1 local_1808;
  undefined8 local_1800;
  char *local_17f8;
  undefined1 local_17f0;
  undefined8 local_17e8;
  char *local_17e0;
  undefined1 local_17d8;
  undefined8 local_17d0;
  char *local_17c8;
  undefined1 local_17c0;
  undefined8 local_17b8;
  char *local_17b0;
  undefined1 local_17a8;
  undefined8 local_17a0;
  char *local_1798;
  undefined1 local_1790;
  undefined8 local_1788;
  char *local_1780;
  undefined1 local_1778;
  undefined8 local_1770;
  char *local_1768;
  undefined1 local_1760;
  undefined8 local_1758;
  char *local_1750;
  undefined1 local_1748;
  undefined8 local_1740;
  char *local_1738;
  undefined1 local_1730;
  undefined8 local_1728;
  char *local_1720;
  undefined1 local_1718;
  undefined8 local_1710;
  char *local_1708;
  undefined1 local_1700;
  undefined8 local_16f8;
  char *local_16f0;
  undefined1 local_16e8;
  undefined8 local_16e0;
  char *local_16d8;
  undefined1 local_16d0;
  undefined8 local_16c8;
  char *local_16c0;
  undefined1 local_16b8;
  undefined8 local_16b0;
  char *local_16a8;
  undefined1 local_16a0;
  undefined8 local_1698;
  char *local_1690;
  undefined1 local_1688;
  undefined8 local_1680;
  char *local_1678;
  undefined1 local_1670;
  undefined8 local_1668;
  char *local_1660;
  undefined1 local_1658;
  undefined8 local_1650;
  char *local_1648;
  undefined1 local_1640;
  undefined8 local_1638;
  char *local_1630;
  undefined1 local_1628;
  undefined8 local_1620;
  char *local_1618;
  undefined1 local_1610;
  undefined8 local_1608;
  char *local_1600;
  undefined1 local_15f8;
  undefined8 local_15f0;
  char *local_15e8;
  undefined1 local_15e0;
  undefined8 local_15d8;
  char *local_15d0;
  undefined1 local_15c8;
  undefined8 local_15c0;
  char *local_15b8;
  undefined1 local_15b0;
  undefined8 local_15a8;
  char *local_15a0;
  undefined1 local_1598;
  undefined8 local_1590;
  char *local_1588;
  undefined1 local_1580;
  undefined8 local_1578;
  char *local_1570;
  undefined1 local_1568;
  undefined8 local_1560;
  char *local_1558;
  undefined1 local_1550;
  undefined8 local_1548;
  char *local_1540;
  undefined1 local_1538;
  undefined8 local_1530;
  char *local_1528;
  undefined1 local_1520;
  undefined8 local_1518;
  char *local_1510;
  undefined1 local_1508;
  undefined8 local_1500;
  char *local_14f8;
  undefined1 local_14f0;
  undefined8 local_14e8;
  char *local_14e0;
  undefined1 local_14d8;
  undefined8 local_14d0;
  char *local_14c8;
  undefined1 local_14c0;
  undefined8 local_14b8;
  char *local_14b0;
  undefined1 local_14a8;
  undefined8 local_14a0;
  char *local_1498;
  undefined1 local_1490;
  undefined8 local_1488;
  char *local_1480;
  undefined1 local_1478;
  undefined8 local_1470;
  char *local_1468;
  undefined1 local_1460;
  undefined8 local_1458;
  char *local_1450;
  undefined1 local_1448;
  undefined8 local_1440;
  char *local_1438;
  undefined1 local_1430;
  undefined8 local_1428;
  char *local_1420;
  undefined1 local_1418;
  undefined8 local_1410;
  char *local_1408;
  undefined1 local_1400;
  undefined8 local_13f8;
  char *local_13f0;
  undefined1 local_13e8;
  undefined8 local_13e0;
  char *local_13d8;
  undefined1 local_13d0;
  undefined8 local_13c8;
  char *local_13c0;
  undefined1 local_13b8;
  undefined8 local_13b0;
  char *local_13a8;
  undefined1 local_13a0;
  undefined8 local_1398;
  char *local_1390;
  undefined1 local_1388;
  undefined8 local_1380;
  char *local_1378;
  undefined1 local_1370;
  undefined8 local_1368;
  char *local_1360;
  undefined1 local_1358;
  undefined8 local_1350;
  char *local_1348;
  undefined1 local_1340;
  undefined8 local_1338;
  char *local_1330;
  undefined1 local_1328;
  undefined8 local_1320;
  char *local_1318;
  undefined1 local_1310;
  undefined8 local_1308;
  char *local_1300;
  undefined1 local_12f8;
  undefined8 local_12f0;
  char *local_12e8;
  undefined1 local_12e0;
  undefined8 local_12d8;
  char *local_12d0;
  undefined1 local_12c8;
  undefined8 local_12c0;
  char *local_12b8;
  undefined1 local_12b0;
  undefined8 local_12a8;
  char *local_12a0;
  undefined1 local_1298;
  undefined8 local_1290;
  char *local_1288;
  undefined1 local_1280;
  undefined8 local_1278;
  char *local_1270;
  undefined1 local_1268;
  undefined8 local_1260;
  char *local_1258;
  undefined1 local_1250;
  undefined8 local_1248;
  char *local_1240;
  undefined1 local_1238;
  undefined8 local_1230;
  char *local_1228;
  undefined1 local_1220;
  undefined8 local_1218;
  char *local_1210;
  undefined1 local_1208;
  undefined8 local_1200;
  char *local_11f8;
  undefined1 local_11f0;
  undefined8 local_11e8;
  char *local_11e0;
  undefined1 local_11d8;
  undefined8 local_11d0;
  char *local_11c8;
  undefined1 local_11c0;
  undefined8 local_11b8;
  char *local_11b0;
  undefined1 local_11a8;
  undefined8 local_11a0;
  char *local_1198;
  undefined1 local_1190;
  undefined8 local_1188;
  char *local_1180;
  undefined1 local_1178;
  undefined8 local_1170;
  char *local_1168;
  undefined1 local_1160;
  undefined8 local_1158;
  char *local_1150;
  undefined1 local_1148;
  undefined8 local_1140;
  char *local_1138;
  undefined1 local_1130;
  undefined8 local_1128;
  char *local_1120;
  undefined1 local_1118;
  undefined8 local_1110;
  char *local_1108;
  undefined1 local_1100;
  undefined8 local_10f8;
  char *local_10f0;
  undefined1 local_10e8;
  undefined8 local_10e0;
  char *local_10d8;
  undefined1 local_10d0;
  undefined8 local_10c8;
  char *local_10c0;
  undefined1 local_10b8;
  undefined8 local_10b0;
  char *local_10a8;
  undefined1 local_10a0;
  undefined8 local_1098;
  char *local_1090;
  undefined1 local_1088;
  undefined8 local_1080;
  char *local_1078;
  undefined1 local_1070;
  undefined8 local_1068;
  char *local_1060;
  undefined1 local_1058;
  undefined8 local_1050;
  char *local_1048;
  undefined1 local_1040;
  undefined8 local_1038;
  char *local_1030;
  undefined1 local_1028;
  undefined8 local_1020;
  char *local_1018;
  undefined1 local_1010;
  undefined8 local_1008;
  char *local_1000;
  undefined1 local_ff8;
  undefined8 local_ff0;
  char *local_fe8;
  undefined1 local_fe0;
  undefined8 local_fd8;
  char *local_fd0;
  undefined1 local_fc8;
  undefined8 local_fc0;
  char *local_fb8;
  undefined1 local_fb0;
  undefined8 local_fa8;
  char *local_fa0;
  undefined1 local_f98;
  undefined8 local_f90;
  char *local_f88;
  undefined1 local_f80;
  undefined8 local_f78;
  char *local_f70;
  undefined1 local_f68;
  undefined8 local_f60;
  char *local_f58;
  undefined1 local_f50;
  undefined8 local_f48;
  char *local_f40;
  undefined1 local_f38;
  undefined8 local_f30;
  char *local_f28;
  undefined1 local_f20;
  undefined8 local_f18;
  char *local_f10;
  undefined1 local_f08;
  undefined8 local_f00;
  char *local_ef8;
  undefined1 local_ef0;
  undefined8 local_ee8;
  char *local_ee0;
  undefined1 local_ed8;
  undefined8 local_ed0;
  char *local_ec8;
  undefined1 local_ec0;
  undefined8 local_eb8;
  char *local_eb0;
  undefined1 local_ea8;
  undefined8 local_ea0;
  char *local_e98;
  undefined1 local_e90;
  undefined8 local_e88;
  char *local_e80;
  undefined1 local_e78;
  undefined8 local_e70;
  char *local_e68;
  undefined1 local_e60;
  undefined8 local_e58;
  char *local_e50;
  undefined1 local_e48;
  undefined8 local_e40;
  char *local_e38;
  undefined1 local_e30;
  undefined8 local_e28;
  char *local_e20;
  undefined1 local_e18;
  undefined8 local_e10;
  char *local_e08;
  undefined1 local_e00;
  undefined8 local_df8;
  char *local_df0;
  undefined1 local_de8;
  undefined8 local_de0;
  char *local_dd8;
  undefined1 local_dd0;
  undefined8 local_dc8;
  char *local_dc0;
  undefined1 local_db8;
  undefined8 local_db0;
  char *local_da8;
  undefined1 local_da0;
  undefined8 local_d98;
  char *local_d90;
  undefined1 local_d88;
  undefined8 local_d80;
  char *local_d78;
  undefined1 local_d70;
  undefined8 local_d68;
  char *local_d60;
  undefined1 local_d58;
  undefined8 local_d50;
  char *local_d48;
  undefined1 local_d40;
  undefined8 local_d38;
  char *local_d30;
  undefined1 local_d28;
  undefined8 local_d20;
  char *local_d18;
  undefined1 local_d10;
  undefined8 local_d08;
  char *local_d00;
  undefined1 local_cf8;
  undefined8 local_cf0;
  char *local_ce8;
  undefined1 local_ce0;
  undefined8 local_cd8;
  char *local_cd0;
  undefined1 local_cc8;
  undefined8 local_cc0;
  char *local_cb8;
  undefined1 local_cb0;
  undefined8 local_ca8;
  char *local_ca0;
  undefined1 local_c98;
  undefined8 local_c90;
  char *local_c88;
  undefined1 local_c80;
  undefined8 local_c78;
  char *local_c70;
  undefined1 local_c68;
  undefined8 local_c60;
  char *local_c58;
  undefined1 local_c50;
  undefined8 local_c48;
  char *local_c40;
  undefined1 local_c38;
  undefined8 local_c30;
  char *local_c28;
  undefined1 local_c20;
  undefined8 local_c18;
  char *local_c10;
  undefined1 local_c08;
  undefined8 local_c00;
  char *local_bf8;
  undefined1 local_bf0;
  undefined8 local_be8;
  char *local_be0;
  undefined1 local_bd8;
  undefined8 local_bd0;
  char *local_bc8;
  undefined1 local_bc0;
  undefined8 local_bb8;
  char *local_bb0;
  undefined1 local_ba8;
  undefined8 local_ba0;
  char *local_b98;
  undefined1 local_b90;
  undefined8 local_b88;
  char *local_b80;
  undefined1 local_b78;
  undefined8 local_b70;
  char *local_b68;
  undefined1 local_b60;
  undefined8 local_b58;
  char *local_b50;
  undefined1 local_b48;
  undefined8 local_b40;
  char *local_b38;
  undefined1 local_b30;
  undefined8 local_b28;
  char *local_b20;
  undefined1 local_b18;
  undefined8 local_b10;
  char *local_b08;
  undefined1 local_b00;
  undefined8 local_af8;
  char *local_af0;
  undefined1 local_ae8;
  undefined8 local_ae0;
  char *local_ad8;
  undefined1 local_ad0;
  undefined8 local_ac8;
  char *local_ac0;
  undefined1 local_ab8;
  undefined8 local_ab0;
  char *local_aa8;
  undefined1 local_aa0;
  undefined8 local_a98;
  char *local_a90;
  undefined1 local_a88;
  undefined8 local_a80;
  char *local_a78;
  undefined1 local_a70;
  undefined8 local_a68;
  char *local_a60;
  undefined1 local_a58;
  undefined8 local_a50;
  char *local_a48;
  undefined1 local_a40;
  undefined8 local_a38;
  char *local_a30;
  undefined1 local_a28;
  undefined8 local_a20;
  char *local_a18;
  undefined1 local_a10;
  undefined8 local_a08;
  char *local_a00;
  undefined1 local_9f8;
  undefined8 local_9f0;
  char *local_9e8;
  undefined1 local_9e0;
  undefined8 local_9d8;
  char *local_9d0;
  undefined1 local_9c8;
  undefined8 local_9c0;
  char *local_9b8;
  undefined1 local_9b0;
  undefined8 local_9a8;
  char *local_9a0;
  undefined1 local_998;
  undefined8 local_990;
  char *local_988;
  undefined1 local_980;
  undefined8 local_978;
  char *local_970;
  undefined1 local_968;
  undefined8 local_960;
  char *local_958;
  undefined1 local_950;
  undefined8 local_948;
  char *local_940;
  undefined1 local_938;
  undefined8 local_930;
  char *local_928;
  undefined1 local_920;
  undefined8 local_918;
  char *local_910;
  undefined1 local_908;
  undefined8 local_900;
  char *local_8f8;
  undefined1 local_8f0;
  undefined8 local_8e8;
  char *local_8e0;
  undefined1 local_8d8;
  undefined8 local_8d0;
  char *local_8c8;
  undefined1 local_8c0;
  undefined8 local_8b8;
  char *local_8b0;
  undefined1 local_8a8;
  undefined8 local_8a0;
  char *local_898;
  undefined1 local_890;
  undefined8 local_888;
  char *local_880;
  undefined1 local_878;
  undefined8 local_870;
  char *local_868;
  undefined1 local_860;
  undefined8 local_858;
  char *local_850;
  undefined1 local_848;
  undefined8 local_840;
  char *local_838;
  undefined1 local_830;
  undefined8 local_828;
  char *local_820;
  undefined1 local_818;
  undefined8 local_810;
  char *local_808;
  undefined1 local_800;
  undefined8 local_7f8;
  char *local_7f0;
  undefined1 local_7e8;
  undefined8 local_7e0;
  char *local_7d8;
  undefined1 local_7d0;
  undefined8 local_7c8;
  char *local_7c0;
  undefined1 local_7b8;
  undefined8 local_7b0;
  char *local_7a8;
  undefined1 local_7a0;
  undefined8 local_798;
  char *local_790;
  undefined1 local_788;
  undefined8 local_780;
  char *local_778;
  undefined1 local_770;
  undefined8 local_768;
  char *local_760;
  undefined1 local_758;
  undefined8 local_750;
  char *local_748;
  undefined1 local_740;
  undefined8 local_738;
  char *local_730;
  undefined1 local_728;
  undefined8 local_720;
  char *local_718;
  undefined1 local_710;
  undefined8 local_708;
  char *local_700;
  undefined1 local_6f8;
  undefined8 local_6f0;
  char *local_6e8;
  undefined1 local_6e0;
  undefined8 local_6d8;
  char *local_6d0;
  undefined1 local_6c8;
  undefined8 local_6c0;
  char *local_6b8;
  undefined1 local_6b0;
  undefined8 local_6a8;
  char *local_6a0;
  undefined1 local_698;
  undefined8 local_690;
  char *local_688;
  undefined1 local_680;
  undefined8 local_678;
  char *local_670;
  undefined1 local_668;
  undefined8 local_660;
  char *local_658;
  undefined1 local_650;
  undefined8 local_648;
  char *local_640;
  undefined1 local_638;
  undefined8 local_630;
  char *local_628;
  undefined1 local_620;
  undefined8 local_618;
  char *local_610;
  undefined1 local_608;
  undefined8 local_600;
  char *local_5f8;
  undefined1 local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  undefined1 local_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  undefined1 local_5a8;
  undefined8 local_5a0;
  char *local_598;
  undefined1 local_590;
  undefined8 local_588;
  char *local_580;
  undefined1 local_578;
  undefined8 local_570;
  char *local_568;
  undefined1 local_560;
  undefined8 local_558;
  char *local_550;
  undefined1 local_548;
  undefined8 local_540;
  char *local_538;
  undefined1 local_530;
  undefined8 local_528;
  char *local_520;
  undefined1 local_518;
  undefined8 local_510;
  char *local_508;
  undefined1 local_500;
  undefined8 local_4f8;
  char *local_4f0;
  undefined1 local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined1 local_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  undefined1 local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined8 local_498;
  char *local_490;
  undefined1 local_488;
  undefined8 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  char *local_460;
  undefined1 local_458;
  undefined8 local_450;
  char *local_448;
  undefined1 local_440;
  undefined8 local_438;
  char *local_430;
  undefined1 local_428;
  undefined8 local_420;
  char *local_418;
  undefined1 local_410;
  undefined8 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined1 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined1 local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  char *local_370;
  undefined1 local_368;
  undefined8 local_360;
  char *local_358;
  undefined1 local_350;
  undefined8 local_348;
  char *local_340;
  undefined1 local_338;
  undefined8 local_330;
  char *local_328;
  undefined1 local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  undefined1 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 local_290;
  undefined8 local_288;
  char *local_280;
  undefined1 local_278;
  undefined8 local_270;
  char *local_268;
  undefined1 local_260;
  undefined8 local_258;
  char *local_250;
  undefined1 local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230;
  undefined8 local_228;
  char *local_220;
  undefined1 local_218;
  undefined8 local_210;
  char *local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  char *local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined1 local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 local_158;
  undefined8 local_150;
  char *local_148;
  undefined1 local_140;
  undefined8 local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  char *local_118;
  undefined1 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80;
  undefined8 local_78;
  char *local_70;
  undefined1 local_68;
  undefined8 local_60;
  char *local_58;
  undefined1 local_50;
  undefined8 local_48;
  char *local_40;
  
  local_1d18.first = 'A';
  local_1d18.second.m_size = 6;
  local_1d18.second.m_data = "ACTION";
  local_1d00 = 0x41;
  local_1cf8 = 3;
  local_1cf0 = "ADD";
  local_1ce8 = 0x41;
  local_1ce0 = 5;
  local_1cd8 = "AFTER";
  local_1cd0 = 0x41;
  local_1cc8 = 9;
  local_1cc0 = "ALGORITHM";
  local_1cb8 = 0x41;
  local_1cb0 = 3;
  local_1ca8 = "ALL";
  local_1ca0 = 0x41;
  local_1c98 = 5;
  local_1c90 = "ALTER";
  local_1c88 = 0x41;
  local_1c80 = 7;
  local_1c78 = "ANALYZE";
  local_1c70 = 0x41;
  local_1c68 = 3;
  local_1c60 = "ANY";
  local_1c58 = 0x41;
  local_1c50 = 5;
  local_1c48 = "APPLY";
  local_1c40 = 0x41;
  local_1c38 = 2;
  local_1c30 = "AS";
  local_1c28 = 0x41;
  local_1c20 = 3;
  local_1c18 = "ASC";
  local_1c10 = 0x41;
  local_1c08 = 0xd;
  local_1c00 = "AUTHORIZATION";
  local_1bf8 = 0x41;
  local_1bf0 = 0xe;
  local_1be8 = "AUTO_INCREMENT";
  local_1be0 = 0x42;
  local_1bd8 = 6;
  local_1bd0 = "BACKUP";
  local_1bc8 = 0x42;
  local_1bc0 = 3;
  local_1bb8 = "BDB";
  local_1bb0 = 0x42;
  local_1ba8 = 5;
  local_1ba0 = "BEGIN";
  local_1b98 = 0x42;
  local_1b90 = 10;
  local_1b88 = "BERKELEYDB";
  local_1b80 = 0x42;
  local_1b78 = 6;
  local_1b70 = "BIGINT";
  local_1b68 = 0x42;
  local_1b60 = 6;
  local_1b58 = "BINARY";
  local_1b50 = 0x42;
  local_1b48 = 3;
  local_1b40 = "BIT";
  local_1b38 = 0x42;
  local_1b30 = 4;
  local_1b28 = "BLOB";
  local_1b20 = 0x42;
  local_1b18 = 4;
  local_1b10 = "BOOL";
  local_1b08 = 0x42;
  local_1b00 = 7;
  local_1af8 = "BOOLEAN";
  local_1af0 = 0x42;
  local_1ae8 = 5;
  local_1ae0 = "BREAK";
  local_1ad8 = 0x42;
  local_1ad0 = 6;
  local_1ac8 = "BROWSE";
  local_1ac0 = 0x42;
  local_1ab8 = 5;
  local_1ab0 = "BTREE";
  local_1aa8 = 0x42;
  local_1aa0 = 4;
  local_1a98 = "BULK";
  local_1a90 = 0x42;
  local_1a88 = 2;
  local_1a80 = "BY";
  local_1a78 = 0x43;
  local_1a70 = 4;
  local_1a68 = "CALL";
  local_1a60 = 0x43;
  local_1a58 = 8;
  local_1a50 = "CASCADED";
  local_1a48 = 0x43;
  local_1a40 = 4;
  local_1a38 = "CASE";
  local_1a30 = 0x43;
  local_1a28 = 5;
  local_1a20 = "CHAIN";
  local_1a18 = 0x43;
  local_1a10 = 9;
  local_1a08 = "CHARACTER";
  local_1a00 = 0x53;
  local_19f8 = 3;
  local_19f0 = "SET";
  local_19e8 = 0x43;
  local_19e0 = 10;
  local_19d8 = "CHECKPOINT";
  local_19d0 = 0x43;
  local_19c8 = 5;
  local_19c0 = "CLOSE";
  local_19b8 = 0x43;
  local_19b0 = 9;
  local_19a8 = "CLUSTERED";
  local_19a0 = 0x43;
  local_1998 = 8;
  local_1990 = "COALESCE";
  local_1988 = 0x43;
  local_1980 = 7;
  local_1978 = "COLLATE";
  local_1970 = 0x43;
  local_1968 = 7;
  local_1960 = "COLUMNS";
  local_1958 = 0x43;
  local_1950 = 7;
  local_1948 = "COMMENT";
  local_1940 = 0x43;
  local_1938 = 9;
  local_1930 = "COMMITTED";
  local_1928 = 0x43;
  local_1920 = 7;
  local_1918 = "COMPUTE";
  local_1910 = 0x43;
  local_1908 = 7;
  local_1900 = "CONNECT";
  local_18f8 = 0x43;
  local_18f0 = 10;
  local_18e8 = "CONSISTENT";
  local_18e0 = 0x43;
  local_18d8 = 10;
  local_18d0 = "CONSTRAINT";
  local_18c8 = 0x43;
  local_18c0 = 0xd;
  local_18b8 = "CONTAINSTABLE";
  local_18b0 = 0x43;
  local_18a8 = 8;
  local_18a0 = "CONTINUE";
  local_1898 = 0x43;
  local_1890 = 7;
  local_1888 = "CONVERT";
  local_1880 = 0x43;
  local_1878 = 6;
  local_1870 = "CREATE";
  local_1868 = 0x43;
  local_1860 = 5;
  local_1858 = "CROSS";
  local_1850 = 0x43;
  local_1848 = 0xc;
  local_1840 = "CURRENT_DATE";
  local_1838 = 0x5f;
  local_1830 = 5;
  local_1828 = "_TIME";
  local_1820 = 0x5f;
  local_1818 = 10;
  local_1810 = "_TIMESTAMP";
  local_1808 = 0x5f;
  local_1800 = 5;
  local_17f8 = "_USER";
  local_17f0 = 0x43;
  local_17e8 = 6;
  local_17e0 = "CURSOR";
  local_17d8 = 0x43;
  local_17d0 = 5;
  local_17c8 = "CYCLE";
  local_17c0 = 0x44;
  local_17b8 = 9;
  local_17b0 = "DATABASES";
  local_17a8 = 0x44;
  local_17a0 = 8;
  local_1798 = "DATETIME";
  local_1790 = 0x44;
  local_1788 = 3;
  local_1780 = "DAY";
  local_1778 = 0x44;
  local_1770 = 4;
  local_1768 = "DBCC";
  local_1760 = 0x44;
  local_1758 = 10;
  local_1750 = "DEALLOCATE";
  local_1748 = 0x44;
  local_1740 = 3;
  local_1738 = "DEC";
  local_1730 = 0x44;
  local_1728 = 7;
  local_1720 = "DECIMAL";
  local_1718 = 0x44;
  local_1710 = 7;
  local_1708 = "DECLARE";
  local_1700 = 0x44;
  local_16f8 = 7;
  local_16f0 = "DEFAULT";
  local_16e8 = 0x44;
  local_16e0 = 7;
  local_16d8 = "DEFINER";
  local_16d0 = 0x44;
  local_16c8 = 7;
  local_16c0 = "DELAYED";
  local_16b8 = 0x44;
  local_16b0 = 6;
  local_16a8 = "DELETE";
  local_16a0 = 0x44;
  local_1698 = 10;
  local_1690 = "DELIMITERS";
  local_1688 = 0x44;
  local_1680 = 4;
  local_1678 = "DENY";
  local_1670 = 0x44;
  local_1668 = 4;
  local_1660 = "DESC";
  local_1658 = 0x44;
  local_1650 = 8;
  local_1648 = "DESCRIBE";
  local_1640 = 0x44;
  local_1638 = 0xd;
  local_1630 = "DETERMINISTIC";
  local_1628 = 0x44;
  local_1620 = 7;
  local_1618 = "DISABLE";
  local_1610 = 0x44;
  local_1608 = 7;
  local_1600 = "DISCARD";
  local_15f8 = 0x44;
  local_15f0 = 4;
  local_15e8 = "DISK";
  local_15e0 = 0x44;
  local_15d8 = 8;
  local_15d0 = "DISTINCT";
  local_15c8 = 0x44;
  local_15c0 = 0xb;
  local_15b8 = "DISTINCTROW";
  local_15b0 = 0x44;
  local_15a8 = 0xb;
  local_15a0 = "DISTRIBUTED";
  local_1598 = 0x44;
  local_1590 = 2;
  local_1588 = "DO";
  local_1580 = 0x44;
  local_1578 = 6;
  local_1570 = "DOUBLE";
  local_1568 = 0x44;
  local_1560 = 4;
  local_1558 = "DROP";
  local_1550 = 0x44;
  local_1548 = 5;
  local_1540 = "DUMMY";
  local_1538 = 0x44;
  local_1530 = 8;
  local_1528 = "DUMPFILE";
  local_1520 = 0x44;
  local_1518 = 9;
  local_1510 = "DUPLICATE";
  local_1508 = 0x45;
  local_1500 = 6;
  local_14f8 = "ELSEIF";
  local_14f0 = 0x45;
  local_14e8 = 6;
  local_14e0 = "ENABLE";
  local_14d8 = 0x45;
  local_14d0 = 8;
  local_14c8 = "ENCLOSED";
  local_14c0 = 0x45;
  local_14b8 = 3;
  local_14b0 = "END";
  local_14a8 = 0x45;
  local_14a0 = 6;
  local_1498 = "ENGINE";
  local_1490 = 0x45;
  local_1488 = 4;
  local_1480 = "ENUM";
  local_1478 = 0x45;
  local_1470 = 6;
  local_1468 = "ERRLVL";
  local_1460 = 0x45;
  local_1458 = 6;
  local_1450 = "ERRORS";
  local_1448 = 0x45;
  local_1440 = 7;
  local_1438 = "ESCAPED";
  local_1430 = 0x45;
  local_1428 = 6;
  local_1420 = "EXCEPT";
  local_1418 = 0x45;
  local_1410 = 7;
  local_1408 = "EXECUTE";
  local_1400 = 0x45;
  local_13f8 = 6;
  local_13f0 = "EXISTS";
  local_13e8 = 0x45;
  local_13e0 = 4;
  local_13d8 = "EXIT";
  local_13d0 = 0x45;
  local_13c8 = 7;
  local_13c0 = "EXPLAIN";
  local_13b8 = 0x45;
  local_13b0 = 8;
  local_13a8 = "EXTENDED";
  local_13a0 = 0x46;
  local_1398 = 5;
  local_1390 = "FETCH";
  local_1388 = 0x46;
  local_1380 = 6;
  local_1378 = "FIELDS";
  local_1370 = 0x46;
  local_1368 = 4;
  local_1360 = "FILE";
  local_1358 = 0x46;
  local_1350 = 10;
  local_1348 = "FILLFACTOR";
  local_1340 = 0x46;
  local_1338 = 5;
  local_1330 = "FIRST";
  local_1328 = 0x46;
  local_1320 = 5;
  local_1318 = "FIXED";
  local_1310 = 0x46;
  local_1308 = 5;
  local_1300 = "FLOAT";
  local_12f8 = 0x46;
  local_12f0 = 9;
  local_12e8 = "FOLLOWING";
  local_12e0 = 0x46;
  local_12d8 = 3;
  local_12d0 = "FOR";
  local_12c8 = 0x45;
  local_12c0 = 4;
  local_12b8 = "EACH";
  local_12b0 = 0x52;
  local_12a8 = 3;
  local_12a0 = "ROW";
  local_1298 = 0x46;
  local_1290 = 5;
  local_1288 = "FORCE";
  local_1280 = 0x46;
  local_1278 = 7;
  local_1270 = "FOREIGN";
  local_1268 = 0x46;
  local_1260 = 0xd;
  local_1258 = "FREETEXTTABLE";
  local_1250 = 0x46;
  local_1248 = 4;
  local_1240 = "FROM";
  local_1238 = 0x46;
  local_1230 = 4;
  local_1228 = "FULL";
  local_1220 = 0x46;
  local_1218 = 8;
  local_1210 = "FUNCTION";
  local_1208 = 0x47;
  local_1200 = 0x12;
  local_11f8 = "GEOMETRYCOLLECTION";
  local_11f0 = 0x47;
  local_11e8 = 6;
  local_11e0 = "GLOBAL";
  local_11d8 = 0x47;
  local_11d0 = 4;
  local_11c8 = "GOTO";
  local_11c0 = 0x47;
  local_11b8 = 5;
  local_11b0 = "GRANT";
  local_11a8 = 0x47;
  local_11a0 = 5;
  local_1198 = "GROUP";
  local_1190 = 0x48;
  local_1188 = 7;
  local_1180 = "HANDLER";
  local_1178 = 0x48;
  local_1170 = 4;
  local_1168 = "HASH";
  local_1160 = 0x48;
  local_1158 = 6;
  local_1150 = "HAVING";
  local_1148 = 0x48;
  local_1140 = 8;
  local_1138 = "HOLDLOCK";
  local_1130 = 0x48;
  local_1128 = 4;
  local_1120 = "HOUR";
  local_1118 = 0x49;
  local_1110 = 0xf;
  local_1108 = "IDENTITY_INSERT";
  local_1100 = 0x43;
  local_10f8 = 3;
  local_10f0 = "COL";
  local_10e8 = 0x49;
  local_10e0 = 2;
  local_10d8 = "IF";
  local_10d0 = 0x49;
  local_10c8 = 6;
  local_10c0 = "IGNORE";
  local_10b8 = 0x49;
  local_10b0 = 6;
  local_10a8 = "IMPORT";
  local_10a0 = 0x49;
  local_1098 = 5;
  local_1090 = "INDEX";
  local_1088 = 0x49;
  local_1080 = 6;
  local_1078 = "INFILE";
  local_1070 = 0x49;
  local_1068 = 5;
  local_1060 = "INNER";
  local_1058 = 0x49;
  local_1050 = 6;
  local_1048 = "INNODB";
  local_1040 = 0x49;
  local_1038 = 5;
  local_1030 = "INOUT";
  local_1028 = 0x49;
  local_1020 = 6;
  local_1018 = "INSERT";
  local_1010 = 0x49;
  local_1008 = 3;
  local_1000 = "INT";
  local_ff8 = 0x49;
  local_ff0 = 7;
  local_fe8 = "INTEGER";
  local_fe0 = 0x49;
  local_fd8 = 9;
  local_fd0 = "INTERSECT";
  local_fc8 = 0x49;
  local_fc0 = 8;
  local_fb8 = "INTERVAL";
  local_fb0 = 0x49;
  local_fa8 = 4;
  local_fa0 = "INTO";
  local_f98 = 0x49;
  local_f90 = 7;
  local_f88 = "INVOKER";
  local_f80 = 0x49;
  local_f78 = 9;
  local_f70 = "ISOLATION";
  local_f68 = 0x49;
  local_f60 = 7;
  local_f58 = "ITERATE";
  local_f50 = 0x4a;
  local_f48 = 4;
  local_f40 = "JOIN";
  local_f38 = 0x4b;
  local_f30 = 4;
  local_f28 = "KEYS";
  local_f20 = 0x4b;
  local_f18 = 4;
  local_f10 = "KILL";
  local_f08 = 0x4c;
  local_f00 = 8;
  local_ef8 = "LANGUAGE";
  local_ef0 = 0x4c;
  local_ee8 = 4;
  local_ee0 = "LAST";
  local_ed8 = 0x4c;
  local_ed0 = 5;
  local_ec8 = "LEAVE";
  local_ec0 = 0x4c;
  local_eb8 = 4;
  local_eb0 = "LEFT";
  local_ea8 = 0x4c;
  local_ea0 = 5;
  local_e98 = "LEVEL";
  local_e90 = 0x4c;
  local_e88 = 5;
  local_e80 = "LIMIT";
  local_e78 = 0x4c;
  local_e70 = 6;
  local_e68 = "LINENO";
  local_e60 = 0x4c;
  local_e58 = 5;
  local_e50 = "LINES";
  local_e48 = 0x4c;
  local_e40 = 10;
  local_e38 = "LINESTRING";
  local_e30 = 0x4c;
  local_e28 = 4;
  local_e20 = "LOAD";
  local_e18 = 0x4c;
  local_e10 = 5;
  local_e08 = "LOCAL";
  local_e00 = 0x4c;
  local_df8 = 4;
  local_df0 = "LOCK";
  local_de8 = 0x4c;
  local_de0 = 8;
  local_dd8 = "LONGBLOB";
  local_dd0 = 0x54;
  local_dc8 = 4;
  local_dc0 = "TEXT";
  local_db8 = 0x4c;
  local_db0 = 4;
  local_da8 = "LOOP";
  local_da0 = 0x4d;
  local_d98 = 7;
  local_d90 = "MATCHED";
  local_d88 = 0x4d;
  local_d80 = 10;
  local_d78 = "MEDIUMBLOB";
  local_d70 = 0x49;
  local_d68 = 3;
  local_d60 = "INT";
  local_d58 = 0x54;
  local_d50 = 4;
  local_d48 = "TEXT";
  local_d40 = 0x4d;
  local_d38 = 5;
  local_d30 = "MERGE";
  local_d28 = 0x4d;
  local_d20 = 9;
  local_d18 = "MIDDLEINT";
  local_d10 = 0x4d;
  local_d08 = 6;
  local_d00 = "MINUTE";
  local_cf8 = 0x4d;
  local_cf0 = 4;
  local_ce8 = "MODE";
  local_ce0 = 0x4d;
  local_cd8 = 8;
  local_cd0 = "MODIFIES";
  local_cc8 = 0x4d;
  local_cc0 = 6;
  local_cb8 = "MODIFY";
  local_cb0 = 0x4d;
  local_ca8 = 5;
  local_ca0 = "MONTH";
  local_c98 = 0x4d;
  local_c90 = 0xf;
  local_c88 = "MULTILINESTRING";
  local_c80 = 0x50;
  local_c78 = 5;
  local_c70 = "POINT";
  local_c68 = 0x50;
  local_c60 = 7;
  local_c58 = "POLYGON";
  local_c50 = 0x4e;
  local_c48 = 8;
  local_c40 = "NATIONAL";
  local_c38 = 0x4e;
  local_c30 = 7;
  local_c28 = "NATURAL";
  local_c20 = 0x4e;
  local_c18 = 5;
  local_c10 = "NCHAR";
  local_c08 = 0x4e;
  local_c00 = 4;
  local_bf8 = "NEXT";
  local_bf0 = 0x4e;
  local_be8 = 2;
  local_be0 = "NO";
  local_bd8 = 0x4e;
  local_bd0 = 0xc;
  local_bc8 = "NONCLUSTERED";
  local_bc0 = 0x4e;
  local_bb8 = 6;
  local_bb0 = "NULLIF";
  local_ba8 = 0x4e;
  local_ba0 = 7;
  local_b98 = "NUMERIC";
  local_b90 = 0x4f;
  local_b88 = 3;
  local_b80 = "OFF";
  local_b78 = 0x4f;
  local_b70 = 7;
  local_b68 = "OFFSETS";
  local_b60 = 0x4f;
  local_b58 = 2;
  local_b50 = "ON";
  local_b48 = 0x4f;
  local_b40 = 0xe;
  local_b38 = "OPENDATASOURCE";
  local_b30 = 0x51;
  local_b28 = 5;
  local_b20 = "QUERY";
  local_b18 = 0x52;
  local_b10 = 6;
  local_b08 = "ROWSET";
  local_b00 = 0x4f;
  local_af8 = 8;
  local_af0 = "OPTIMIZE";
  local_ae8 = 0x4f;
  local_ae0 = 10;
  local_ad8 = "OPTIONALLY";
  local_ad0 = 0x4f;
  local_ac8 = 5;
  local_ac0 = "ORDER";
  local_ab8 = 0x4f;
  local_ab0 = 5;
  local_aa8 = "OUTER";
  local_aa0 = 0x46;
  local_a98 = 4;
  local_a90 = "FILE";
  local_a88 = 0x4f;
  local_a80 = 4;
  local_a78 = "OVER";
  local_a70 = 0x50;
  local_a68 = 7;
  local_a60 = "PARTIAL";
  local_a58 = 0x50;
  local_a50 = 9;
  local_a48 = "PARTITION";
  local_a40 = 0x50;
  local_a38 = 7;
  local_a30 = "PERCENT";
  local_a28 = 0x50;
  local_a20 = 5;
  local_a18 = "PIVOT";
  local_a10 = 0x50;
  local_a08 = 4;
  local_a00 = "PLAN";
  local_9f8 = 0x50;
  local_9f0 = 5;
  local_9e8 = "POINT";
  local_9e0 = 0x50;
  local_9d8 = 7;
  local_9d0 = "POLYGON";
  local_9c8 = 0x50;
  local_9c0 = 9;
  local_9b8 = "PRECEDING";
  local_9b0 = 0x50;
  local_9a8 = 9;
  local_9a0 = "PRECISION";
  local_998 = 0x50;
  local_990 = 7;
  local_988 = "PREPARE";
  local_980 = 0x50;
  local_978 = 4;
  local_970 = "PREV";
  local_968 = 0x50;
  local_960 = 7;
  local_958 = "PRIMARY";
  local_950 = 0x50;
  local_948 = 5;
  local_940 = "PRINT";
  local_938 = 0x50;
  local_930 = 10;
  local_928 = "PRIVILEGES";
  local_920 = 0x50;
  local_918 = 9;
  local_910 = "PROCEDURE";
  local_908 = 0x50;
  local_900 = 6;
  local_8f8 = "PUBLIC";
  local_8f0 = 0x50;
  local_8e8 = 5;
  local_8e0 = "PURGE";
  local_8d8 = 0x51;
  local_8d0 = 5;
  local_8c8 = "QUICK";
  local_8c0 = 0x52;
  local_8b8 = 9;
  local_8b0 = "RAISERROR";
  local_8a8 = 0x52;
  local_8a0 = 5;
  local_898 = "READS";
  local_890 = 0x52;
  local_888 = 4;
  local_880 = "REAL";
  local_878 = 0x52;
  local_870 = 0xb;
  local_868 = "RECONFIGURE";
  local_860 = 0x52;
  local_858 = 10;
  local_850 = "REFERENCES";
  local_848 = 0x52;
  local_840 = 7;
  local_838 = "RELEASE";
  local_830 = 0x52;
  local_828 = 6;
  local_820 = "RENAME";
  local_818 = 0x52;
  local_810 = 10;
  local_808 = "REPEATABLE";
  local_800 = 0x52;
  local_7f8 = 7;
  local_7f0 = "REPLACE";
  local_7e8 = 0x52;
  local_7e0 = 0xb;
  local_7d8 = "REPLICATION";
  local_7d0 = 0x52;
  local_7c8 = 7;
  local_7c0 = "REQUIRE";
  local_7b8 = 0x52;
  local_7b0 = 8;
  local_7a8 = "RESIGNAL";
  local_7a0 = 0x52;
  local_798 = 7;
  local_790 = "RESTORE";
  local_788 = 0x52;
  local_780 = 8;
  local_778 = "RESTRICT";
  local_770 = 0x52;
  local_768 = 7;
  local_760 = "RETURNS";
  local_758 = 0x52;
  local_750 = 6;
  local_748 = "REVOKE";
  local_740 = 0x52;
  local_738 = 5;
  local_730 = "RIGHT";
  local_728 = 0x52;
  local_720 = 8;
  local_718 = "ROLLBACK";
  local_710 = 0x52;
  local_708 = 7;
  local_700 = "ROUTINE";
  local_6f8 = 0x52;
  local_6f0 = 8;
  local_6e8 = "ROWCOUNT";
  local_6e0 = 0x47;
  local_6d8 = 7;
  local_6d0 = "GUIDCOL";
  local_6c8 = 0x52;
  local_6c0 = 5;
  local_6b8 = "RTREE";
  local_6b0 = 0x52;
  local_6a8 = 4;
  local_6a0 = "RULE";
  local_698 = 0x53;
  local_690 = 9;
  local_688 = "SAVEPOINT";
  local_680 = 0x53;
  local_678 = 6;
  local_670 = "SCHEMA";
  local_668 = 0x53;
  local_660 = 6;
  local_658 = "SECOND";
  local_650 = 0x53;
  local_648 = 6;
  local_640 = "SELECT";
  local_638 = 0x53;
  local_630 = 0xc;
  local_628 = "SERIALIZABLE";
  local_620 = 0x53;
  local_618 = 0xc;
  local_610 = "SESSION_USER";
  local_608 = 0x53;
  local_600 = 7;
  local_5f8 = "SETUSER";
  local_5f0 = 0x53;
  local_5e8 = 5;
  local_5e0 = "SHARE";
  local_5d8 = 0x53;
  local_5d0 = 4;
  local_5c8 = "SHOW";
  local_5c0 = 0x53;
  local_5b8 = 8;
  local_5b0 = "SHUTDOWN";
  local_5a8 = 0x53;
  local_5a0 = 6;
  local_598 = "SIMPLE";
  local_590 = 0x53;
  local_588 = 8;
  local_580 = "SMALLINT";
  local_578 = 0x53;
  local_570 = 8;
  local_568 = "SNAPSHOT";
  local_560 = 0x53;
  local_558 = 4;
  local_550 = "SOME";
  local_548 = 0x53;
  local_540 = 6;
  local_538 = "SONAME";
  local_530 = 0x53;
  local_528 = 3;
  local_520 = "SQL";
  local_518 = 0x53;
  local_510 = 8;
  local_508 = "STARTING";
  local_500 = 0x53;
  local_4f8 = 10;
  local_4f0 = "STATISTICS";
  local_4e8 = 0x53;
  local_4e0 = 6;
  local_4d8 = "STATUS";
  local_4d0 = 0x53;
  local_4c8 = 7;
  local_4c0 = "STRIPED";
  local_4b8 = 0x53;
  local_4b0 = 0xb;
  local_4a8 = "SYSTEM_USER";
  local_4a0 = 0x54;
  local_498 = 6;
  local_490 = "TABLES";
  local_488 = 0x54;
  local_480 = 10;
  local_478 = "TABLESPACE";
  local_470 = 0x54;
  local_468 = 9;
  local_460 = "TEMPORARY";
  local_458 = 0x54;
  local_450 = 5;
  local_448 = "TABLE";
  local_440 = 0x54;
  local_438 = 10;
  local_430 = "TERMINATED";
  local_428 = 0x54;
  local_420 = 8;
  local_418 = "TEXTSIZE";
  local_410 = 0x54;
  local_408 = 4;
  local_400 = "THEN";
  local_3f8 = 0x54;
  local_3f0 = 9;
  local_3e8 = "TIMESTAMP";
  local_3e0 = 0x54;
  local_3d8 = 8;
  local_3d0 = "TINYBLOB";
  local_3c8 = 0x49;
  local_3c0 = 3;
  local_3b8 = "INT";
  local_3b0 = 0x54;
  local_3a8 = 4;
  local_3a0 = "TEXT";
  local_398 = 0x54;
  local_390 = 3;
  local_388 = "TOP";
  local_380 = 0x54;
  local_378 = 0xc;
  local_370 = "TRANSACTIONS";
  local_368 = 0x54;
  local_360 = 7;
  local_358 = "TRIGGER";
  local_350 = 0x54;
  local_348 = 8;
  local_340 = "TRUNCATE";
  local_338 = 0x54;
  local_330 = 7;
  local_328 = "TSEQUAL";
  local_320 = 0x54;
  local_318 = 5;
  local_310 = "TYPES";
  local_308 = 0x55;
  local_300 = 9;
  local_2f8 = "UNBOUNDED";
  local_2f0 = 0x55;
  local_2e8 = 0xb;
  local_2e0 = "UNCOMMITTED";
  local_2d8 = 0x55;
  local_2d0 = 9;
  local_2c8 = "UNDEFINED";
  local_2c0 = 0x55;
  local_2b8 = 5;
  local_2b0 = "UNION";
  local_2a8 = 0x55;
  local_2a0 = 6;
  local_298 = "UNIQUE";
  local_290 = 0x55;
  local_288 = 6;
  local_280 = "UNLOCK";
  local_278 = 0x55;
  local_270 = 7;
  local_268 = "UNPIVOT";
  local_260 = 0x55;
  local_258 = 8;
  local_250 = "UNSIGNED";
  local_248 = 0x55;
  local_240 = 10;
  local_238 = "UPDATETEXT";
  local_230 = 0x55;
  local_228 = 5;
  local_220 = "USAGE";
  local_218 = 0x55;
  local_210 = 3;
  local_208 = "USE";
  local_200 = 0x55;
  local_1f8 = 4;
  local_1f0 = "USER";
  local_1e8 = 0x55;
  local_1e0 = 5;
  local_1d8 = "USING";
  local_1d0 = 0x56;
  local_1c8 = 6;
  local_1c0 = "VALUES";
  local_1b8 = 0x56;
  local_1b0 = 9;
  local_1a8 = "VARBINARY";
  local_1a0 = 0x43;
  local_198 = 4;
  local_190 = "CHAR";
  local_188 = 0x43;
  local_180 = 9;
  local_178 = "CHARACTER";
  local_170 = 0x59;
  local_168 = 4;
  local_160 = "YING";
  local_158 = 0x56;
  local_150 = 4;
  local_148 = "VIEW";
  local_140 = 0x57;
  local_138 = 7;
  local_130 = "WAITFOR";
  local_128 = 0x57;
  local_120 = 8;
  local_118 = "WARNINGS";
  local_110 = 0x57;
  local_108 = 4;
  local_100 = "WHEN";
  local_f8 = 0x57;
  local_f0 = 5;
  local_e8 = "WHERE";
  local_e0 = 0x57;
  local_d8 = 5;
  local_d0 = "WHILE";
  local_c8 = 0x57;
  local_c0 = 4;
  local_b8 = "WITH";
  local_b0 = 0x52;
  local_a8 = 6;
  local_a0 = "ROLLUP";
  local_98 = 0x49;
  local_90 = 2;
  local_88 = "IN";
  local_80 = 0x57;
  local_78 = 4;
  local_70 = "WORK";
  local_68 = 0x57;
  local_60 = 9;
  local_58 = "WRITETEXT";
  local_50 = 0x59;
  local_48 = 4;
  local_40 = "YEAR";
  list._M_len = 0x134;
  list._M_array = &local_1d18;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1d28,list);
  QMultiHash<char,_QLatin1String>::operator=(&sql_keywords,&QStack_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1d28);
  local_1d18.first = '\0';
  local_1d18._1_7_ = 0;
  local_1d18.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&sql_types,(QMultiHash<char,_QLatin1String> *)&local_1d18);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d18);
  local_1d18.first = 'A';
  local_1d18.second.m_size = 4;
  local_1d18.second.m_data = "TRUE";
  local_1d00 = 0x46;
  local_1cf8 = 5;
  local_1cf0 = "FALSE";
  local_1ce8 = 0x4e;
  local_1ce0 = 4;
  local_1cd8 = "NULL";
  list_00._M_len = 3;
  list_00._M_array = &local_1d18;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1d28,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&sql_literals,&QStack_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1d28);
  local_1d18.first = 'A';
  local_1d18.second.m_size = 3;
  local_1d18.second.m_data = "AVG";
  local_1d00 = 0x43;
  local_1cf8 = 5;
  local_1cf0 = "COUNT";
  local_1ce8 = 0x46;
  local_1ce0 = 5;
  local_1cd8 = "FIRST";
  local_1cd0 = 0x46;
  local_1cc8 = 6;
  local_1cc0 = "FORMAT";
  local_1cb8 = 0x4c;
  local_1cb0 = 4;
  local_1ca8 = "LAST";
  local_1ca0 = 0x4c;
  local_1c98 = 5;
  local_1c90 = "LCASE";
  local_1c88 = 0x4c;
  local_1c80 = 3;
  local_1c78 = "LEN";
  local_1c70 = 0x4d;
  local_1c68 = 3;
  local_1c60 = "MAX";
  local_1c58 = 0x4d;
  local_1c50 = 3;
  local_1c48 = "MID";
  local_1c40 = 0x4d;
  local_1c38 = 3;
  local_1c30 = "MIN";
  local_1c28 = 0x4d;
  local_1c20 = 3;
  local_1c18 = "MOD";
  local_1c10 = 0x4e;
  local_1c08 = 3;
  local_1c00 = "NOW";
  local_1bf8 = 0x52;
  local_1bf0 = 5;
  local_1be8 = "ROUND";
  local_1be0 = 0x53;
  local_1bd8 = 3;
  local_1bd0 = "SUM";
  local_1bc8 = 0x55;
  local_1bc0 = 5;
  local_1bb8 = "UCASE";
  list_01._M_len = 0xf;
  list_01._M_array = &local_1d18;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1d28,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&sql_builtin,&QStack_1d28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1d28);
  local_1d18.first = '\0';
  local_1d18._1_7_ = 0;
  local_1d18.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&sql_other,(QMultiHash<char,_QLatin1String> *)&local_1d18);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1d18);
  return;
}

Assistant:

void initSQLData() {
    sql_keywords = {{('A'), QLatin1String("ACTION")},
                    {('A'), QLatin1String("ADD")},
                    {('A'), QLatin1String("AFTER")},
                    {('A'), QLatin1String("ALGORITHM")},
                    {('A'), QLatin1String("ALL")},
                    {('A'), QLatin1String("ALTER")},
                    {('A'), QLatin1String("ANALYZE")},
                    {('A'), QLatin1String("ANY")},
                    {('A'), QLatin1String("APPLY")},
                    {('A'), QLatin1String("AS")},
                    {('A'), QLatin1String("ASC")},
                    {('A'), QLatin1String("AUTHORIZATION")},
                    {('A'), QLatin1String("AUTO_INCREMENT")},
                    {('B'), QLatin1String("BACKUP")},
                    {('B'), QLatin1String("BDB")},
                    {('B'), QLatin1String("BEGIN")},
                    {('B'), QLatin1String("BERKELEYDB")},
                    {('B'), QLatin1String("BIGINT")},
                    {('B'), QLatin1String("BINARY")},
                    {('B'), QLatin1String("BIT")},
                    {('B'), QLatin1String("BLOB")},
                    {('B'), QLatin1String("BOOL")},
                    {('B'), QLatin1String("BOOLEAN")},
                    {('B'), QLatin1String("BREAK")},
                    {('B'), QLatin1String("BROWSE")},
                    {('B'), QLatin1String("BTREE")},
                    {('B'), QLatin1String("BULK")},
                    {('B'), QLatin1String("BY")},
                    {('C'), QLatin1String("CALL")},
                    {('C'), QLatin1String("CASCADED")},
                    {('C'), QLatin1String("CASE")},
                    {('C'), QLatin1String("CHAIN")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('S'), QLatin1String("SET")},
                    {('C'), QLatin1String("CHECKPOINT")},
                    {('C'), QLatin1String("CLOSE")},
                    {('C'), QLatin1String("CLUSTERED")},
                    {('C'), QLatin1String("COALESCE")},
                    {('C'), QLatin1String("COLLATE")},
                    {('C'), QLatin1String("COLUMNS")},
                    {('C'), QLatin1String("COMMENT")},
                    {('C'), QLatin1String("COMMITTED")},
                    {('C'), QLatin1String("COMPUTE")},
                    {('C'), QLatin1String("CONNECT")},
                    {('C'), QLatin1String("CONSISTENT")},
                    {('C'), QLatin1String("CONSTRAINT")},
                    {('C'), QLatin1String("CONTAINSTABLE")},
                    {('C'), QLatin1String("CONTINUE")},
                    {('C'), QLatin1String("CONVERT")},
                    {('C'), QLatin1String("CREATE")},
                    {('C'), QLatin1String("CROSS")},
                    {('C'), QLatin1String("CURRENT_DATE")},
                    {('_'), QLatin1String("_TIME")},
                    {('_'), QLatin1String("_TIMESTAMP")},
                    {('_'), QLatin1String("_USER")},
                    {('C'), QLatin1String("CURSOR")},
                    {('C'), QLatin1String("CYCLE")},
                    {('D'), QLatin1String("DATABASES")},
                    {('D'), QLatin1String("DATETIME")},
                    {('D'), QLatin1String("DAY")},
                    {('D'), QLatin1String("DBCC")},
                    {('D'), QLatin1String("DEALLOCATE")},
                    {('D'), QLatin1String("DEC")},
                    {('D'), QLatin1String("DECIMAL")},
                    {('D'), QLatin1String("DECLARE")},
                    {('D'), QLatin1String("DEFAULT")},
                    {('D'), QLatin1String("DEFINER")},
                    {('D'), QLatin1String("DELAYED")},
                    {('D'), QLatin1String("DELETE")},
                    {('D'), QLatin1String("DELIMITERS")},
                    {('D'), QLatin1String("DENY")},
                    {('D'), QLatin1String("DESC")},
                    {('D'), QLatin1String("DESCRIBE")},
                    {('D'), QLatin1String("DETERMINISTIC")},
                    {('D'), QLatin1String("DISABLE")},
                    {('D'), QLatin1String("DISCARD")},
                    {('D'), QLatin1String("DISK")},
                    {('D'), QLatin1String("DISTINCT")},
                    {('D'), QLatin1String("DISTINCTROW")},
                    {('D'), QLatin1String("DISTRIBUTED")},
                    {('D'), QLatin1String("DO")},
                    {('D'), QLatin1String("DOUBLE")},
                    {('D'), QLatin1String("DROP")},
                    {('D'), QLatin1String("DUMMY")},
                    {('D'), QLatin1String("DUMPFILE")},
                    {('D'), QLatin1String("DUPLICATE")},
                    {('E'), QLatin1String("ELSEIF")},
                    {('E'), QLatin1String("ENABLE")},
                    {('E'), QLatin1String("ENCLOSED")},
                    {('E'), QLatin1String("END")},
                    {('E'), QLatin1String("ENGINE")},
                    {('E'), QLatin1String("ENUM")},
                    {('E'), QLatin1String("ERRLVL")},
                    {('E'), QLatin1String("ERRORS")},
                    {('E'), QLatin1String("ESCAPED")},
                    {('E'), QLatin1String("EXCEPT")},
                    {('E'), QLatin1String("EXECUTE")},
                    {('E'), QLatin1String("EXISTS")},
                    {('E'), QLatin1String("EXIT")},
                    {('E'), QLatin1String("EXPLAIN")},
                    {('E'), QLatin1String("EXTENDED")},
                    {('F'), QLatin1String("FETCH")},
                    {('F'), QLatin1String("FIELDS")},
                    {('F'), QLatin1String("FILE")},
                    {('F'), QLatin1String("FILLFACTOR")},
                    {('F'), QLatin1String("FIRST")},
                    {('F'), QLatin1String("FIXED")},
                    {('F'), QLatin1String("FLOAT")},
                    {('F'), QLatin1String("FOLLOWING")},
                    {('F'), QLatin1String("FOR")},
                    {('E'), QLatin1String("EACH")},
                    {('R'), QLatin1String("ROW")},
                    {('F'), QLatin1String("FORCE")},
                    {('F'), QLatin1String("FOREIGN")},
                    {('F'), QLatin1String("FREETEXTTABLE")},
                    {('F'), QLatin1String("FROM")},
                    {('F'), QLatin1String("FULL")},
                    {('F'), QLatin1String("FUNCTION")},
                    {('G'), QLatin1String("GEOMETRYCOLLECTION")},
                    {('G'), QLatin1String("GLOBAL")},
                    {('G'), QLatin1String("GOTO")},
                    {('G'), QLatin1String("GRANT")},
                    {('G'), QLatin1String("GROUP")},
                    {('H'), QLatin1String("HANDLER")},
                    {('H'), QLatin1String("HASH")},
                    {('H'), QLatin1String("HAVING")},
                    {('H'), QLatin1String("HOLDLOCK")},
                    {('H'), QLatin1String("HOUR")},
                    {('I'), QLatin1String("IDENTITY_INSERT")},
                    {('C'), QLatin1String("COL")},
                    {('I'), QLatin1String("IF")},
                    {('I'), QLatin1String("IGNORE")},
                    {('I'), QLatin1String("IMPORT")},
                    {('I'), QLatin1String("INDEX")},
                    {('I'), QLatin1String("INFILE")},
                    {('I'), QLatin1String("INNER")},
                    {('I'), QLatin1String("INNODB")},
                    {('I'), QLatin1String("INOUT")},
                    {('I'), QLatin1String("INSERT")},
                    {('I'), QLatin1String("INT")},
                    {('I'), QLatin1String("INTEGER")},
                    {('I'), QLatin1String("INTERSECT")},
                    {('I'), QLatin1String("INTERVAL")},
                    {('I'), QLatin1String("INTO")},
                    {('I'), QLatin1String("INVOKER")},
                    {('I'), QLatin1String("ISOLATION")},
                    {('I'), QLatin1String("ITERATE")},
                    {('J'), QLatin1String("JOIN")},
                    {('K'), QLatin1String("KEYS")},
                    {('K'), QLatin1String("KILL")},
                    {('L'), QLatin1String("LANGUAGE")},
                    {('L'), QLatin1String("LAST")},
                    {('L'), QLatin1String("LEAVE")},
                    {('L'), QLatin1String("LEFT")},
                    {('L'), QLatin1String("LEVEL")},
                    {('L'), QLatin1String("LIMIT")},
                    {('L'), QLatin1String("LINENO")},
                    {('L'), QLatin1String("LINES")},
                    {('L'), QLatin1String("LINESTRING")},
                    {('L'), QLatin1String("LOAD")},
                    {('L'), QLatin1String("LOCAL")},
                    {('L'), QLatin1String("LOCK")},
                    {('L'), QLatin1String("LONGBLOB")},
                    {('T'), QLatin1String("TEXT")},
                    {('L'), QLatin1String("LOOP")},
                    {('M'), QLatin1String("MATCHED")},
                    {('M'), QLatin1String("MEDIUMBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('M'), QLatin1String("MERGE")},
                    {('M'), QLatin1String("MIDDLEINT")},
                    {('M'), QLatin1String("MINUTE")},
                    {('M'), QLatin1String("MODE")},
                    {('M'), QLatin1String("MODIFIES")},
                    {('M'), QLatin1String("MODIFY")},
                    {('M'), QLatin1String("MONTH")},
                    {('M'), QLatin1String("MULTILINESTRING")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('N'), QLatin1String("NATIONAL")},
                    {('N'), QLatin1String("NATURAL")},
                    {('N'), QLatin1String("NCHAR")},
                    {('N'), QLatin1String("NEXT")},
                    {('N'), QLatin1String("NO")},
                    {('N'), QLatin1String("NONCLUSTERED")},
                    {('N'), QLatin1String("NULLIF")},
                    {('N'), QLatin1String("NUMERIC")},
                    {('O'), QLatin1String("OFF")},
                    {('O'), QLatin1String("OFFSETS")},
                    {('O'), QLatin1String("ON")},
                    {('O'), QLatin1String("OPENDATASOURCE")},
                    {('Q'), QLatin1String("QUERY")},
                    {('R'), QLatin1String("ROWSET")},
                    {('O'), QLatin1String("OPTIMIZE")},
                    {('O'), QLatin1String("OPTIONALLY")},
                    {('O'), QLatin1String("ORDER")},
                    {('O'), QLatin1String("OUTER")},
                    {('F'), QLatin1String("FILE")},
                    {('O'), QLatin1String("OVER")},
                    {('P'), QLatin1String("PARTIAL")},
                    {('P'), QLatin1String("PARTITION")},
                    {('P'), QLatin1String("PERCENT")},
                    {('P'), QLatin1String("PIVOT")},
                    {('P'), QLatin1String("PLAN")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('P'), QLatin1String("PRECEDING")},
                    {('P'), QLatin1String("PRECISION")},
                    {('P'), QLatin1String("PREPARE")},
                    {('P'), QLatin1String("PREV")},
                    {('P'), QLatin1String("PRIMARY")},
                    {('P'), QLatin1String("PRINT")},
                    {('P'), QLatin1String("PRIVILEGES")},
                    {('P'), QLatin1String("PROCEDURE")},
                    {('P'), QLatin1String("PUBLIC")},
                    {('P'), QLatin1String("PURGE")},
                    {('Q'), QLatin1String("QUICK")},
                    {('R'), QLatin1String("RAISERROR")},
                    {('R'), QLatin1String("READS")},
                    {('R'), QLatin1String("REAL")},
                    {('R'), QLatin1String("RECONFIGURE")},
                    {('R'), QLatin1String("REFERENCES")},
                    {('R'), QLatin1String("RELEASE")},
                    {('R'), QLatin1String("RENAME")},
                    {('R'), QLatin1String("REPEATABLE")},
                    {('R'), QLatin1String("REPLACE")},
                    {('R'), QLatin1String("REPLICATION")},
                    {('R'), QLatin1String("REQUIRE")},
                    {('R'), QLatin1String("RESIGNAL")},
                    {('R'), QLatin1String("RESTORE")},
                    {('R'), QLatin1String("RESTRICT")},
                    {('R'), QLatin1String("RETURNS")},
                    {('R'), QLatin1String("REVOKE")},
                    {('R'), QLatin1String("RIGHT")},
                    {('R'), QLatin1String("ROLLBACK")},
                    {('R'), QLatin1String("ROUTINE")},
                    {('R'), QLatin1String("ROWCOUNT")},
                    {('G'), QLatin1String("GUIDCOL")},
                    {('R'), QLatin1String("RTREE")},
                    {('R'), QLatin1String("RULE")},
                    {('S'), QLatin1String("SAVEPOINT")},
                    {('S'), QLatin1String("SCHEMA")},
                    {('S'), QLatin1String("SECOND")},
                    {('S'), QLatin1String("SELECT")},
                    {('S'), QLatin1String("SERIALIZABLE")},
                    {('S'), QLatin1String("SESSION_USER")},
                    {('S'), QLatin1String("SETUSER")},
                    {('S'), QLatin1String("SHARE")},
                    {('S'), QLatin1String("SHOW")},
                    {('S'), QLatin1String("SHUTDOWN")},
                    {('S'), QLatin1String("SIMPLE")},
                    {('S'), QLatin1String("SMALLINT")},
                    {('S'), QLatin1String("SNAPSHOT")},
                    {('S'), QLatin1String("SOME")},
                    {('S'), QLatin1String("SONAME")},
                    {('S'), QLatin1String("SQL")},
                    {('S'), QLatin1String("STARTING")},
                    {('S'), QLatin1String("STATISTICS")},
                    {('S'), QLatin1String("STATUS")},
                    {('S'), QLatin1String("STRIPED")},
                    {('S'), QLatin1String("SYSTEM_USER")},
                    {('T'), QLatin1String("TABLES")},
                    {('T'), QLatin1String("TABLESPACE")},
                    {('T'), QLatin1String("TEMPORARY")},
                    {('T'), QLatin1String("TABLE")},
                    {('T'), QLatin1String("TERMINATED")},
                    {('T'), QLatin1String("TEXTSIZE")},
                    {('T'), QLatin1String("THEN")},
                    {('T'), QLatin1String("TIMESTAMP")},
                    {('T'), QLatin1String("TINYBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('T'), QLatin1String("TOP")},
                    {('T'), QLatin1String("TRANSACTIONS")},
                    {('T'), QLatin1String("TRIGGER")},
                    {('T'), QLatin1String("TRUNCATE")},
                    {('T'), QLatin1String("TSEQUAL")},
                    {('T'), QLatin1String("TYPES")},
                    {('U'), QLatin1String("UNBOUNDED")},
                    {('U'), QLatin1String("UNCOMMITTED")},
                    {('U'), QLatin1String("UNDEFINED")},
                    {('U'), QLatin1String("UNION")},
                    {('U'), QLatin1String("UNIQUE")},
                    {('U'), QLatin1String("UNLOCK")},
                    {('U'), QLatin1String("UNPIVOT")},
                    {('U'), QLatin1String("UNSIGNED")},
                    {('U'), QLatin1String("UPDATETEXT")},
                    {('U'), QLatin1String("USAGE")},
                    {('U'), QLatin1String("USE")},
                    {('U'), QLatin1String("USER")},
                    {('U'), QLatin1String("USING")},
                    {('V'), QLatin1String("VALUES")},
                    {('V'), QLatin1String("VARBINARY")},
                    {('C'), QLatin1String("CHAR")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('Y'), QLatin1String("YING")},
                    {('V'), QLatin1String("VIEW")},
                    {('W'), QLatin1String("WAITFOR")},
                    {('W'), QLatin1String("WARNINGS")},
                    {('W'), QLatin1String("WHEN")},
                    {('W'), QLatin1String("WHERE")},
                    {('W'), QLatin1String("WHILE")},
                    {('W'), QLatin1String("WITH")},
                    {('R'), QLatin1String("ROLLUP")},
                    {('I'), QLatin1String("IN")},
                    {('W'), QLatin1String("WORK")},
                    {('W'), QLatin1String("WRITETEXT")},
                    {('Y'), QLatin1String("YEAR")}};

    sql_types = {

    };

    sql_literals = {
        {('A'), QLatin1String("TRUE")},
        {('F'), QLatin1String("FALSE")},
        {('N'), QLatin1String("NULL")},
    };

    sql_builtin = {
        {('A'), QLatin1String("AVG")},   {('C'), QLatin1String("COUNT")},
        {('F'), QLatin1String("FIRST")}, {('F'), QLatin1String("FORMAT")},
        {('L'), QLatin1String("LAST")},  {('L'), QLatin1String("LCASE")},
        {('L'), QLatin1String("LEN")},   {('M'), QLatin1String("MAX")},
        {('M'), QLatin1String("MID")},   {('M'), QLatin1String("MIN")},
        {('M'), QLatin1String("MOD")},   {('N'), QLatin1String("NOW")},
        {('R'), QLatin1String("ROUND")}, {('S'), QLatin1String("SUM")},
        {('U'), QLatin1String("UCASE")}};

    sql_other = {

    };
}